

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManGetCiLevels(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  long lVar5;
  Vec_Int_t *pVVar6;
  
  if (p->vLevels == (Vec_Int_t *)0x0) {
    p_00 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = p->vCis;
    iVar1 = pVVar6->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar3 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar3 = iVar1;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar3;
    if (iVar3 == 0) {
      piVar2 = (int *)0x0;
      uVar4 = extraout_RDX;
    }
    else {
      piVar2 = (int *)malloc((long)iVar3 << 2);
      uVar4 = extraout_RDX_00;
    }
    p_00->pArray = piVar2;
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        iVar1 = pVVar6->pArray[lVar5];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return p_00;
        }
        pVVar6 = p->vLevels;
        Vec_IntFillExtra(pVVar6,iVar1 + 1,(int)uVar4);
        if (pVVar6->nSize <= iVar1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p_00,pVVar6->pArray[iVar1]);
        lVar5 = lVar5 + 1;
        pVVar6 = p->vCis;
        uVar4 = extraout_RDX_01;
      } while (lVar5 < pVVar6->nSize);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManGetCiLevels( Gia_Man_t * p )  
{
    Vec_Int_t * vCiLevels;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vLevels == NULL )
        return NULL;
    vCiLevels = Vec_IntAlloc( Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vCiLevels, Gia_ObjLevel(p, pObj) );
    return vCiLevels;
}